

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,string *option_flag_name,
          CodeGenerator *generator,string *help_text)

{
  mapped_type *pmVar1;
  GeneratorInfo info;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  CodeGenerator *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>::iterator,_bool>
  local_48;
  
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = 0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  std::__cxx11::string::_M_assign((string *)&local_b0);
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_70 = generator;
  std::__cxx11::string::_M_assign((string *)&local_68);
  pmVar1 = absl::lts_20250127::container_internal::
           btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
           ::operator[]<std::__cxx11::string>
                     ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                       *)&this->generators_by_flag_name_,flag_name);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->option_flag_name);
  pmVar1->generator = local_70;
  std::__cxx11::string::_M_assign((string *)&pmVar1->help_text);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
  ::try_emplace_impl<std::__cxx11::string_const&>
            (&local_48,&this->generators_by_option_name_,option_flag_name);
  std::__cxx11::string::_M_assign((string *)((long)local_48.first.field_1.slot_ + 0x20));
  std::__cxx11::string::_M_assign((string *)((long)local_48.first.field_1.slot_ + 0x40));
  *(CodeGenerator **)((long)local_48.first.field_1.slot_ + 0x60) = local_70;
  std::__cxx11::string::_M_assign((string *)((long)local_48.first.field_1.slot_ + 0x68));
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(
    const std::string& flag_name, const std::string& option_flag_name,
    CodeGenerator* generator, const std::string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.option_flag_name = option_flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
  generators_by_option_name_[option_flag_name] = info;
}